

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.hh
# Opt level: O0

void __thiscall avro::json::JsonGenerator::encodeString(JsonGenerator *this,string *s)

{
  size_t in_RCX;
  void *in_RDX;
  void *__buf;
  JsonGenerator *in_RSI;
  StreamWriter *in_RDI;
  string *in_stack_00000018;
  JsonGenerator *in_stack_00000020;
  
  if (*(int *)&in_RDI[4].next_ == 3) {
    *(undefined4 *)&in_RDI[4].next_ = 5;
  }
  else if (*(int *)&in_RDI[4].next_ == 4) {
    StreamWriter::write(in_RDI,0x2c,in_RDX,in_RCX);
    *(undefined4 *)&in_RDI[4].next_ = 5;
  }
  else if (*(int *)&in_RDI[4].next_ == 5) {
    *(undefined4 *)&in_RDI[4].next_ = 4;
  }
  else {
    sep(in_RSI);
  }
  doEncodeString(in_stack_00000020,in_stack_00000018);
  if (*(int *)&in_RDI[4].next_ == 5) {
    StreamWriter::write(in_RDI,0x3a,__buf,in_RCX);
  }
  return;
}

Assistant:

void encodeString(const std::string& s) {
        if (top == stMap0) {
            top = stKey;
        } else if (top == stMapN) {
            out_.write(',');
            top = stKey;
        } else if (top == stKey) {
            top = stMapN;
        } else {
            sep();
        }
        doEncodeString(s);
        if (top == stKey) {
            out_.write(':');
        }
    }